

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
~ParticleArrayTest_Back_Test
          (ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}